

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O1

vector<duckdb::OpenFileInfo,_true> * __thiscall
duckdb::LocalFileSystem::Glob
          (vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr__,LocalFileSystem *this,
          string *path,FileOpener *opener)

{
  char cVar1;
  pointer pcVar2;
  undefined1 *puVar3;
  string *path_00;
  undefined8 uVar4;
  pointer pOVar5;
  bool bVar6;
  int iVar7;
  idx_t iVar8;
  reference pvVar9;
  optional_idx oVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  IOException *this_00;
  idx_t iVar12;
  idx_t i;
  pointer pbVar13;
  undefined1 *__n;
  undefined8 uVar14;
  undefined4 uVar15;
  undefined8 unaff_RBP;
  vector<duckdb::OpenFileInfo,_true> *__return_storage_ptr___00;
  ulong uVar16;
  _Alloc_hider _Var17;
  uint uVar18;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this_01;
  ulong uVar19;
  ulong uVar20;
  iterator __begin5;
  pointer pbVar22;
  undefined1 *puVar23;
  bool bVar24;
  string home_directory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  splits;
  string search_paths_str;
  vector<duckdb::OpenFileInfo,_true> previous_directories;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  search_paths;
  _Alloc_hider in_stack_fffffffffffffdb8;
  element_type *peStack_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  Val local_228 [2];
  FileOpener *local_208;
  undefined1 *local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_1f8;
  string *local_1e0;
  undefined1 local_1d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  pointer local_1a8;
  undefined1 *local_1a0;
  vector<duckdb::OpenFileInfo,_true> *local_198;
  OpenFileInfo local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  undefined8 local_158;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  undefined8 local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  string local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  undefined8 local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_a0;
  undefined1 *local_88;
  ulong local_80;
  undefined1 local_78 [16];
  LogicalType local_68;
  undefined1 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  undefined7 uVar21;
  
  if (path->_M_string_length == 0) {
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar2 = (path->_M_dataplus)._M_p;
  local_208 = opener;
  local_88 = local_78;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,pcVar2 + path->_M_string_length);
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"file:/","");
  if (local_80 < local_48) {
    uVar15 = 0;
  }
  else {
    uVar21 = (undefined7)((ulong)unaff_RBP >> 8);
    if (local_48 == 0) {
      uVar15 = (undefined4)CONCAT71(uVar21,1);
    }
    else {
      iVar7 = bcmp(local_50,local_88,local_48);
      uVar15 = (undefined4)CONCAT71(uVar21,iVar7 == 0);
    }
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  iVar8 = GetFileUrlOffset(path);
  local_200 = (undefined1 *)CONCAT44(local_200._4_4_,uVar15);
  this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
            __return_storage_ptr__;
  local_1e0 = path;
  local_198 = __return_storage_ptr__;
  if (iVar8 < path->_M_string_length) {
    iVar12 = 0;
    this_01 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8;
    do {
      cVar1 = (local_1e0->_M_dataplus)._M_p[iVar8];
      if ((cVar1 == '\\') || (cVar1 == '/')) {
        if (iVar8 != iVar12) {
          if (local_1f8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_1f8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
            ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1e0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffdb8);
          }
          else {
            ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1e0);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      (this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &stack0xfffffffffffffdb8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)in_stack_fffffffffffffdb8._M_p != &local_238) {
            operator_delete(in_stack_fffffffffffffdb8._M_p);
          }
        }
        iVar12 = iVar8 + 1;
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < local_1e0->_M_string_length);
  }
  path_00 = local_1e0;
  ::std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdb8,(ulong)local_1e0);
  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &stack0xfffffffffffffdb8);
  __return_storage_ptr___00 = local_198;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)in_stack_fffffffffffffdb8._M_p != &local_238) {
    operator_delete(in_stack_fffffffffffffdb8._M_p);
  }
  bVar6 = FileSystem::IsPathAbsolute(&this->super_FileSystem,path_00);
  uVar21 = (undefined7)((ulong)this_01 >> 8);
  uVar19 = CONCAT71(uVar21,1);
  if (!bVar6) {
    pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::operator[](&local_1f8,0);
    _Var17._M_p = (pointer)&local_238;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdb8,":","");
    oVar10 = StringUtil::Find(pvVar9,(string *)&stack0xfffffffffffffdb8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != &local_238) {
      operator_delete(_Var17._M_p);
    }
    if (oVar10.index == 0xffffffffffffffff) {
      pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_1f8,0);
      iVar7 = ::std::__cxx11::string::compare((char *)pvVar9);
      if (iVar7 == 0) {
        FileSystem::GetHomeDirectory_abi_cxx11_((optional_ptr<duckdb::FileOpener,_true>)_Var17._M_p)
        ;
        if (peStack_240 == (element_type *)0x0) {
          bVar6 = true;
          uVar19 = 0;
        }
        else {
          pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](&local_1f8,0);
          ::std::__cxx11::string::_M_assign((string *)pvVar9);
          uVar19 = path_00->_M_string_length;
          bVar6 = uVar19 != 0;
          if (bVar6) {
            bVar6 = true;
            uVar20 = 1;
            do {
              uVar18 = (byte)(path_00->_M_dataplus)._M_p[uVar20 - 1] - 0x2a;
              if ((uVar18 < 0x32) && ((0x2000000200001U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) break;
              bVar6 = uVar20 < uVar19;
              bVar24 = uVar20 != uVar19;
              uVar20 = uVar20 + 1;
            } while (bVar24);
          }
          uVar19 = CONCAT71(uVar21,1);
          if (bVar6) {
            bVar6 = true;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_c0,(ulong)path_00);
            ::std::operator+(&local_190.path,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &stack0xfffffffffffffdb8,&local_c0);
            (*(this->super_FileSystem)._vptr_FileSystem[0x19])
                      (__return_storage_ptr___00,this,&local_190,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.path._M_dataplus._M_p != &local_190.path.field_2) {
              operator_delete(local_190.path._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
            bVar6 = false;
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var17._M_p != &local_238) {
          operator_delete(_Var17._M_p);
        }
        if (!bVar6) goto LAB_0039274b;
      }
      else {
        uVar19 = 0;
      }
    }
  }
  uVar20 = path_00->_M_string_length;
  bVar6 = uVar20 != 0;
  if (bVar6) {
    bVar6 = true;
    uVar16 = 1;
    do {
      uVar18 = (byte)(path_00->_M_dataplus)._M_p[uVar16 - 1] - 0x2a;
      if ((uVar18 < 0x32) && ((0x2000000200001U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) break;
      bVar6 = uVar16 < uVar20;
      bVar24 = uVar16 != uVar20;
      uVar16 = uVar16 + 1;
    } while (bVar24);
  }
  if (bVar6) {
    local_1b8._M_allocated_capacity = 0;
    local_1b8._8_8_ = (pointer)0x0;
    local_1a8 = (pointer)0x0;
    if (SUB81(uVar19,0) == false) {
      LogicalType::LogicalType(&local_68,SQLNULL);
      Value::Value((Value *)&stack0xfffffffffffffdb8,&local_68);
      LogicalType::~LogicalType(&local_68);
      if (local_208 == (FileOpener *)0x0) {
        bVar6 = false;
      }
      else {
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"file_search_path","")
        ;
        iVar7 = (*local_208->_vptr_FileOpener[3])(local_208,&local_c0,&stack0xfffffffffffffdb8);
        bVar6 = (char)iVar7 != '\x03';
      }
      if ((local_208 != (FileOpener *)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2)) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (bVar6) {
        Value::ToString_abi_cxx11_((string *)local_1d8,(Value *)&stack0xfffffffffffffdb8);
        local_1a0 = (undefined1 *)CONCAT44(local_1a0._4_4_,(int)uVar19);
        StringUtil::Split(&local_a0,(string *)local_1d8,',');
        if (local_a0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_a0.
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          paVar11 = &local_190.path.field_2;
          pbVar22 = local_a0.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            pcVar2 = (pbVar22->_M_dataplus)._M_p;
            local_120 = &local_110;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_120,pcVar2,pcVar2 + pbVar22->_M_string_length);
            if (local_120 == &local_110) {
              local_190.path.field_2._8_8_ = local_110._8_8_;
              local_190.path._M_dataplus._M_p = (pointer)paVar11;
            }
            else {
              local_190.path._M_dataplus._M_p = (pointer)local_120;
            }
            local_190.path.field_2._M_allocated_capacity._1_7_ =
                 local_110._M_allocated_capacity._1_7_;
            local_190.path.field_2._M_local_buf[0] = local_110._M_local_buf[0];
            local_190.path._M_string_length = local_118;
            local_118 = 0;
            local_110._M_local_buf[0] = '\0';
            local_190.extended_info.internal.
            super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            local_190.extended_info.internal.
            super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_120 = &local_110;
            std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
            emplace_back<duckdb::OpenFileInfo>
                      ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                       &local_1b8,&local_190);
            if (local_190.extended_info.internal.
                super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                         local_190.extended_info.internal.
                         super___shared_ptr<duckdb::ExtendedOpenFileInfo,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_190.path._M_dataplus._M_p != paVar11) {
              operator_delete(local_190.path._M_dataplus._M_p);
            }
            if (local_120 != &local_110) {
              operator_delete(local_120);
            }
            pbVar22 = pbVar22 + 1;
          } while (pbVar22 !=
                   local_a0.
                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        }
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_a0);
        if ((pointer)local_1d8._0_8_ != (pointer)(local_1d8 + 0x10)) {
          operator_delete((void *)local_1d8._0_8_);
        }
        uVar19 = (ulong)local_1a0 & 0xffffffff;
        __return_storage_ptr___00 = local_198;
      }
      Value::~Value((Value *)&stack0xfffffffffffffdb8);
    }
    else {
      pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::operator[](&local_1f8,0);
      pcVar2 = (pvVar9->_M_dataplus)._M_p;
      local_e0 = &local_d0;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e0,pcVar2,pcVar2 + pvVar9->_M_string_length);
      _Var17._M_p = (pointer)local_e0;
      if (local_e0 == &local_d0) {
        local_238._8_8_ = local_d0._8_8_;
        _Var17._M_p = (pointer)&local_238;
      }
      local_238._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
      local_238._M_local_buf[0] = local_d0._M_local_buf[0];
      local_d8 = 0;
      local_d0._M_local_buf[0] = '\0';
      local_228[0].bigint = 0;
      local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_e0 = &local_d0;
      std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
      emplace_back<duckdb::OpenFileInfo>
                ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_1b8,
                 (OpenFileInfo *)&stack0xfffffffffffffdb8);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var17._M_p != &local_238) {
        operator_delete(_Var17._M_p);
      }
      if (local_e0 != &local_d0) {
        operator_delete(local_e0);
      }
    }
    pbVar22 = local_1f8.
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (local_1f8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1f8.
        super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_1a0 = (undefined1 *)CONCAT44(local_1a0._4_4_,(int)uVar19);
      uVar20 = 0;
      pbVar13 = local_1f8.
                super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar7 = ::std::__cxx11::string::compare((char *)pbVar13);
        uVar20 = uVar20 + (iVar7 == 0);
        pbVar13 = pbVar13 + 1;
      } while (pbVar13 != pbVar22);
      uVar19 = (ulong)local_1a0 & 0xffffffff;
      if (1 < uVar20) {
        this_00 = (IOException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xfffffffffffffdb8,"Cannot use multiple \'**\' in one path","");
        IOException::IOException(this_00,(string *)&stack0xfffffffffffffdb8);
        __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    local_1a0 = (undefined1 *)(uVar19 & 0xff);
    __n = &DAT_00000001;
    if ((char)local_200 == '\0') {
      __n = local_1a0;
    }
    puVar23 = (undefined1 *)
              ((long)local_1f8.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_1f8.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5);
    if (__n < puVar23) {
      do {
        pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                 ::operator[](&local_1f8,(size_type)__n);
        uVar4 = local_1b8._8_8_;
        uVar19 = pvVar9->_M_string_length;
        bVar6 = uVar19 != 0;
        if (bVar6) {
          bVar6 = true;
          uVar20 = 1;
          do {
            uVar18 = (byte)(pvVar9->_M_dataplus)._M_p[uVar20 - 1] - 0x2a;
            if ((uVar18 < 0x32) && ((0x2000000200001U >> ((ulong)uVar18 & 0x3f) & 1) != 0)) break;
            bVar6 = uVar20 < uVar19;
            bVar24 = uVar20 != uVar19;
            uVar20 = uVar20 + 1;
          } while (bVar24);
        }
        puVar3 = __n + 1;
        local_1d8._0_8_ = (pointer)0x0;
        local_1d8._8_8_ = (pointer)0x0;
        local_1d8._16_8_ = (pointer)0x0;
        paVar11 = &local_100.field_2;
        local_200 = puVar3;
        if (bVar6) {
          pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](&local_1f8,(size_type)__n);
          iVar7 = ::std::__cxx11::string::compare((char *)pvVar9);
          uVar4 = local_1b8._8_8_;
          if (iVar7 == 0) {
            if (puVar3 != puVar23) {
              std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::operator=
                        ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                         local_1d8,
                         (vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                         &local_1b8);
            }
            uVar4 = local_1b8._8_8_;
            uVar14 = local_1b8._M_allocated_capacity;
            if (local_1b8._M_allocated_capacity == local_1b8._8_8_) {
              _Var17._M_p = (pointer)&local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffdb8,".","");
              RecursiveGlobDirectories
                        (&this->super_FileSystem,(string *)&stack0xfffffffffffffdb8,
                         (vector<duckdb::OpenFileInfo,_true> *)local_1d8,local_200 != puVar23,false)
              ;
              goto LAB_0039258a;
            }
            do {
              RecursiveGlobDirectories
                        (&this->super_FileSystem,(string *)uVar14,
                         (vector<duckdb::OpenFileInfo,_true> *)local_1d8,local_200 != puVar23,true);
              uVar14 = uVar14 + 0x30;
            } while (uVar14 != uVar4);
          }
          else {
            uVar14 = local_1b8._M_allocated_capacity;
            if (local_1b8._M_allocated_capacity == local_1b8._8_8_) {
              _Var17._M_p = (pointer)&local_238;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&stack0xfffffffffffffdb8,".","");
              pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[](&local_1f8,(size_type)__n);
              GlobFilesInternal(&this->super_FileSystem,(string *)&stack0xfffffffffffffdb8,pvVar9,
                                local_200 != puVar23,(vector<duckdb::OpenFileInfo,_true> *)local_1d8
                                ,false);
LAB_0039258a:
              paVar11 = &local_238;
              goto LAB_0039260e;
            }
            do {
              pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                       ::operator[](&local_1f8,(size_type)__n);
              GlobFilesInternal(&this->super_FileSystem,(string *)uVar14,pvVar9,local_200 != puVar23
                                ,(vector<duckdb::OpenFileInfo,_true> *)local_1d8,true);
              uVar14 = uVar14 + 0x30;
            } while (uVar14 != uVar4);
          }
        }
        else {
          if (local_1b8._M_allocated_capacity != local_1b8._8_8_) {
            uVar14 = local_1b8._M_allocated_capacity;
            if (puVar3 == puVar23) {
              do {
                pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[](&local_1f8,(size_type)__n);
                FileSystem::JoinPath
                          (&local_190.path,&this->super_FileSystem,(string *)uVar14,pvVar9);
                iVar7 = (*(this->super_FileSystem)._vptr_FileSystem[0x12])
                                  (this,&local_190,local_208);
                if (((char)iVar7 != '\0') ||
                   (iVar7 = (*(this->super_FileSystem)._vptr_FileSystem[0xd])
                                      (this,&local_190,local_208), (char)iVar7 != '\0')) {
                  local_160 = &local_150;
                  ::std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_160,local_190.path._M_dataplus._M_p,
                             local_190.path._M_dataplus._M_p + local_190.path._M_string_length);
                  _Var17._M_p = (pointer)local_160;
                  if (local_160 == &local_150) {
                    local_238._8_8_ = local_150._8_8_;
                    _Var17._M_p = (pointer)&local_238;
                  }
                  local_238._M_allocated_capacity._1_7_ = local_150._M_allocated_capacity._1_7_;
                  local_238._M_local_buf[0] = local_150._M_local_buf[0];
                  local_158 = 0;
                  local_150._M_local_buf[0] = '\0';
                  local_228[0].bigint = 0;
                  local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                  local_160 = &local_150;
                  std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                  emplace_back<duckdb::OpenFileInfo>
                            ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                             local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
                  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
                      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var17._M_p != &local_238) {
                    operator_delete(_Var17._M_p);
                  }
                  if (local_160 != &local_150) {
                    operator_delete(local_160);
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_190.path._M_dataplus._M_p != &local_190.path.field_2) {
                  operator_delete(local_190.path._M_dataplus._M_p);
                }
                uVar14 = uVar14 + 0x30;
              } while (uVar14 != uVar4);
            }
            else {
              do {
                pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                         ::operator[](&local_1f8,(size_type)__n);
                FileSystem::JoinPath(&local_100,&this->super_FileSystem,(string *)uVar14,pvVar9);
                _Var17._M_p = local_100._M_dataplus._M_p;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p == paVar11) {
                  local_238._8_8_ = local_100.field_2._8_8_;
                  _Var17._M_p = (pointer)&local_238;
                }
                local_238._M_allocated_capacity._1_7_ =
                     local_100.field_2._M_allocated_capacity._1_7_;
                local_238._M_local_buf[0] = local_100.field_2._M_local_buf[0];
                local_100._M_string_length = 0;
                local_100.field_2._M_local_buf[0] = '\0';
                local_228[0].bigint = 0;
                local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
                local_100._M_dataplus._M_p = (pointer)paVar11;
                std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
                emplace_back<duckdb::OpenFileInfo>
                          ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                           local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Var17._M_p != &local_238) {
                  operator_delete(_Var17._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_100._M_dataplus._M_p != paVar11) {
                  operator_delete(local_100._M_dataplus._M_p);
                }
                uVar14 = uVar14 + 0x30;
              } while (uVar14 != uVar4);
            }
            goto LAB_00392618;
          }
          pvVar9 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                   ::operator[](&local_1f8,(size_type)__n);
          pcVar2 = (pvVar9->_M_dataplus)._M_p;
          local_140 = &local_130;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_140,pcVar2,pcVar2 + pvVar9->_M_string_length);
          _Var17._M_p = (pointer)local_140;
          if (local_140 == &local_130) {
            local_238._8_8_ = local_130._8_8_;
            _Var17._M_p = (pointer)&local_238;
          }
          local_238._M_allocated_capacity._1_7_ = local_130._M_allocated_capacity._1_7_;
          local_238._M_local_buf[0] = local_130._M_local_buf[0];
          local_138 = 0;
          local_130._M_local_buf[0] = '\0';
          local_228[0].bigint = 0;
          local_228[0].hugeint.upper = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_140 = &local_130;
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::
          emplace_back<duckdb::OpenFileInfo>
                    ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                     local_1d8,(OpenFileInfo *)&stack0xfffffffffffffdb8);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228[0]._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var17._M_p != &local_238) {
            operator_delete(_Var17._M_p);
          }
          paVar11 = &local_130;
          _Var17._M_p = (pointer)local_140;
LAB_0039260e:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var17._M_p != paVar11) {
            operator_delete(_Var17._M_p);
          }
        }
LAB_00392618:
        __return_storage_ptr___00 = local_198;
        pOVar5 = local_1a8;
        __n = local_200;
        if (local_1d8._0_8_ == local_1d8._8_8_) {
          FetchFileWithoutGlob(local_198,this,local_1e0,local_208,SUB81(local_1a0,0));
LAB_00392734:
          std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                    ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                     local_1d8);
          goto LAB_0039273e;
        }
        if (local_200 == puVar23) {
          (local_198->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1d8._0_8_;
          (local_198->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)local_1d8._8_8_;
          (local_198->super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_1d8._16_8_;
          local_1d8._0_8_ = (pointer)0x0;
          local_1d8._8_8_ = (pointer)0x0;
          local_1d8._16_8_ = (pointer)0x0;
          goto LAB_00392734;
        }
        local_1b8._M_allocated_capacity = local_1d8._0_8_;
        local_1b8._8_8_ = local_1d8._8_8_;
        local_1a8 = (pointer)local_1d8._16_8_;
        local_238._M_allocated_capacity = (size_type)pOVar5;
        local_1d8._0_8_ = (pointer)0x0;
        local_1d8._8_8_ = (pointer)0x0;
        local_1d8._16_8_ = (pointer)0x0;
        std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                  ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)
                   &stack0xfffffffffffffdb8);
        std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
                  ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)local_1d8)
        ;
        puVar23 = (undefined1 *)
                  ((long)local_1f8.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_1f8.
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5);
        __return_storage_ptr___00 = local_198;
      } while (__n < puVar23);
    }
    (__return_storage_ptr___00->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr___00->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr___00->
    super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>).
    super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_0039273e:
    std::vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>::~vector
              ((vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_> *)&local_1b8);
  }
  else {
    FetchFileWithoutGlob(__return_storage_ptr___00,this,path_00,local_208,SUB81(uVar19,0));
  }
LAB_0039274b:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1f8);
  return __return_storage_ptr___00;
}

Assistant:

vector<OpenFileInfo> LocalFileSystem::Glob(const string &path, FileOpener *opener) {
	if (path.empty()) {
		return vector<OpenFileInfo>();
	}
	// split up the path into separate chunks
	vector<string> splits;

	bool is_file_url = StringUtil::StartsWith(path, "file:/");
	idx_t file_url_path_offset = GetFileUrlOffset(path);

	idx_t last_pos = 0;
	for (idx_t i = file_url_path_offset; i < path.size(); i++) {
		if (path[i] == '\\' || path[i] == '/') {
			if (i == last_pos) {
				// empty: skip this position
				last_pos = i + 1;
				continue;
			}
			if (splits.empty()) {
				//				splits.push_back(path.substr(file_url_path_offset, i-file_url_path_offset));
				splits.push_back(path.substr(0, i));
			} else {
				splits.push_back(path.substr(last_pos, i - last_pos));
			}
			last_pos = i + 1;
		}
	}
	splits.push_back(path.substr(last_pos, path.size() - last_pos));
	// handle absolute paths
	bool absolute_path = false;
	if (IsPathAbsolute(path)) {
		// first character is a slash -  unix absolute path
		absolute_path = true;
	} else if (StringUtil::Contains(splits[0], ":")) { // TODO: this is weird? shouldn't IsPathAbsolute handle this?
		// first split has a colon -  windows absolute path
		absolute_path = true;
	} else if (splits[0] == "~") {
		// starts with home directory
		auto home_directory = GetHomeDirectory(opener);
		if (!home_directory.empty()) {
			absolute_path = true;
			splits[0] = home_directory;
			D_ASSERT(path[0] == '~');
			if (!HasGlob(path)) {
				return Glob(home_directory + path.substr(1));
			}
		}
	}
	// Check if the path has a glob at all
	if (!HasGlob(path)) {
		// no glob: return only the file (if it exists or is a pipe)
		return FetchFileWithoutGlob(path, opener, absolute_path);
	}
	vector<OpenFileInfo> previous_directories;
	if (absolute_path) {
		// for absolute paths, we don't start by scanning the current directory
		previous_directories.push_back(splits[0]);
	} else {
		// If file_search_path is set, use those paths as the first glob elements
		Value value;
		if (opener && opener->TryGetCurrentSetting("file_search_path", value)) {
			auto search_paths_str = value.ToString();
			vector<std::string> search_paths = StringUtil::Split(search_paths_str, ',');
			for (const auto &search_path : search_paths) {
				previous_directories.push_back(search_path);
			}
		}
	}

	if (HasMultipleCrawl(splits)) {
		throw IOException("Cannot use multiple \'**\' in one path");
	}

	idx_t start_index;
	if (is_file_url) {
		start_index = 1;
	} else if (absolute_path) {
		start_index = 1;
	} else {
		start_index = 0;
	}

	for (idx_t i = start_index ? 1 : 0; i < splits.size(); i++) {
		bool is_last_chunk = i + 1 == splits.size();
		bool has_glob = HasGlob(splits[i]);
		// if it's the last chunk we need to find files, otherwise we find directories
		// not the last chunk: gather a list of all directories that match the glob pattern
		vector<OpenFileInfo> result;
		if (!has_glob) {
			// no glob, just append as-is
			if (previous_directories.empty()) {
				result.push_back(splits[i]);
			} else {
				if (is_last_chunk) {
					for (auto &prev_directory : previous_directories) {
						const string filename = JoinPath(prev_directory.path, splits[i]);
						if (FileExists(filename, opener) || DirectoryExists(filename, opener)) {
							result.push_back(filename);
						}
					}
				} else {
					for (auto &prev_directory : previous_directories) {
						result.push_back(JoinPath(prev_directory.path, splits[i]));
					}
				}
			}
		} else {
			if (IsCrawl(splits[i])) {
				if (!is_last_chunk) {
					result = previous_directories;
				}
				if (previous_directories.empty()) {
					RecursiveGlobDirectories(*this, ".", result, !is_last_chunk, false);
				} else {
					for (auto &prev_dir : previous_directories) {
						RecursiveGlobDirectories(*this, prev_dir.path, result, !is_last_chunk, true);
					}
				}
			} else {
				if (previous_directories.empty()) {
					// no previous directories: list in the current path
					GlobFilesInternal(*this, ".", splits[i], !is_last_chunk, result, false);
				} else {
					// previous directories
					// we iterate over each of the previous directories, and apply the glob of the current directory
					for (auto &prev_directory : previous_directories) {
						GlobFilesInternal(*this, prev_directory.path, splits[i], !is_last_chunk, result, true);
					}
				}
			}
		}
		if (result.empty()) {
			// no result found that matches the glob
			// last ditch effort: search the path as a string literal
			return FetchFileWithoutGlob(path, opener, absolute_path);
		}
		if (is_last_chunk) {
			return result;
		}
		previous_directories = std::move(result);
	}
	return vector<OpenFileInfo>();
}